

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

U32 XXH_swap32(U32 x)

{
  U32 x_local;
  
  return x << 0x18 | (x & 0xff00) << 8 | x >> 8 & 0xff00 | x >> 0x18;
}

Assistant:

static U32 XXH_swap32 (U32 x)
{
    return  ((x << 24) & 0xff000000 ) |
            ((x <<  8) & 0x00ff0000 ) |
            ((x >>  8) & 0x0000ff00 ) |
            ((x >> 24) & 0x000000ff );
}